

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
 __thiscall lrit::File::getDataFromFile(File *this)

{
  long lVar1;
  __mbstate_t _Var2;
  byte bVar3;
  type poVar4;
  pointer poVar5;
  streamoff sVar6;
  runtime_error *prVar7;
  long in_RSI;
  __uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
  in_RDI;
  int *unaff_retaddr;
  char (*in_stack_00000008) [2];
  char (*in_stack_00000010) [90];
  char (*in_stack_00000018) [28];
  streamoff delta;
  streampos fpos2;
  streampos fpos1;
  __single_object ifs;
  pointer in_stack_fffffffffffffe68;
  fpos<__mbstate_t> *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  string local_e0 [32];
  long local_c0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  int iStack_b0;
  anon_union_4_2_91654ee9_for___value aStack_ac;
  fpos<__mbstate_t> local_a8;
  fpos<__mbstate_t> local_98;
  undefined1 local_85;
  undefined4 local_84;
  string local_80 [32];
  undefined8 local_60;
  undefined8 local_58;
  undefined1 local_4d;
  undefined4 local_4c;
  string local_48 [72];
  
  std::make_unique<lrit::(anonymous_namespace)::offsetifstream,std::__cxx11::string_const&>
            (in_stack_fffffffffffffe88);
  poVar4 = std::
           unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
           ::operator*((unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
                        *)in_stack_fffffffffffffe70);
  bVar3 = std::ios::operator!((ios *)((long)&(poVar4->super_istream)._vptr_basic_istream +
                                     (long)(poVar4->super_istream)._vptr_basic_istream[-3]));
  if ((bVar3 & 1) != 0) {
    local_4d = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_4c = 0x9a;
    util::str<char[28],char[90],char[2],int>
              (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
    std::runtime_error::runtime_error(prVar7,local_48);
    local_4d = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar5 = std::
           unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
           ::operator->((unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
                         *)0x1274dd);
  std::fpos<__mbstate_t>::fpos(in_stack_fffffffffffffe70,(streamoff)in_stack_fffffffffffffe68);
  std::istream::seekg(poVar5,local_60,local_58);
  poVar4 = std::
           unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
           ::operator*((unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
                        *)in_stack_fffffffffffffe70);
  bVar3 = std::ios::operator!((ios *)((long)&(poVar4->super_istream)._vptr_basic_istream +
                                     (long)(poVar4->super_istream)._vptr_basic_istream[-3]));
  if ((bVar3 & 1) != 0) {
    local_85 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_84 = 0x9c;
    util::str<char[28],char[90],char[2],int>
              (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
    std::runtime_error::runtime_error(prVar7,local_80);
    local_85 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (*(char *)(in_RSI + 0x84) == '\0') {
    std::
    unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
    ::operator->((unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
                  *)0x12765f);
    local_98 = (fpos<__mbstate_t>)std::istream::tellg();
    poVar5 = std::
             unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
             ::operator->((unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
                           *)0x12769a);
    std::istream::seekg((long)poVar5,_S_beg);
    std::
    unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
    ::operator->((unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
                  *)0x1276ba);
    local_a8 = (fpos<__mbstate_t>)std::istream::tellg();
    poVar5 = std::
             unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
             ::operator->((unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
                           *)0x1276f5);
    _Var2 = local_98._M_state;
    sVar6 = local_98._M_off;
    local_b8 = (undefined4)local_98._M_off;
    uStack_b4 = local_98._M_off._4_4_;
    iStack_b0 = local_98._M_state.__count;
    aStack_ac.__wch = local_98._M_state.__value.__wch;
    std::istream::seekg(poVar5,sVar6,_Var2);
    sVar6 = std::fpos<__mbstate_t>::operator-(&local_a8,&local_98);
    local_c0 = sVar6 - (int)(*(long *)(in_RSI + 0x90) + 7U >> 3);
    if (0 < local_c0) {
      poVar5 = std::
               unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
               ::operator->((unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
                             *)0x127786);
      lVar1 = local_c0;
      std::
      unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
      ::operator->((unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
                    *)0x1277a2);
      std::istream::seekg((long)poVar5,(_Ios_Seekdir)lVar1);
      poVar4 = std::
               unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
               ::operator*((unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
                            *)in_stack_fffffffffffffe70);
      bVar3 = std::ios::operator!((ios *)((long)&(poVar4->super_istream)._vptr_basic_istream +
                                         (long)(poVar4->super_istream)._vptr_basic_istream[-3]));
      if ((bVar3 & 1) != 0) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        util::str<char[28],char[90],char[2],int>
                  (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
        std::runtime_error::runtime_error(prVar7,local_e0);
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  std::
  unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
  ::operator->((unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
                *)0x1278e0);
  anon_unknown_0::offsetifstream::mark((offsetifstream *)0x1278e8);
  std::
  unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
  ::release((unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
             *)0x1278f7);
  std::unique_ptr<std::istream,std::default_delete<std::istream>>::
  unique_ptr<std::default_delete<std::istream>,void>
            ((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
              *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::
  unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
  ::~unique_ptr((unique_ptr<lrit::(anonymous_namespace)::offsetifstream,_std::default_delete<lrit::(anonymous_namespace)::offsetifstream>_>
                 *)in_stack_fffffffffffffe70);
  return (__uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
          )(tuple<std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
            )in_RDI.
             super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl;
}

Assistant:

std::unique_ptr<std::istream> File::getDataFromFile() const {
  auto ifs = std::make_unique<offsetifstream>(file_);
  ASSERT(*ifs);
  ifs->seekg(ph_.totalHeaderLength);
  ASSERT(*ifs);

  // Because of a bug in goesdec, LRIT image files that used
  // compression have an initial bogus line, followed by the real
  // image. Detect if this is one of those files and ignore the bogus
  // line if so. See 2bd11f16 for more info.
  if (ph_.fileType == 0) {
    // Number of bytes remaining in file
    std::streampos fpos1 = ifs->tellg();
    ifs->seekg(0, std::ios::end);
    std::streampos fpos2 = ifs->tellg();
    ifs->seekg(fpos1);
    // Seek to first byte beyond bogus line
    // Round up (hence the + 7) so that images with 1 bit per pixel
    // and a number of pixels not equal to a power of 8 are not
    // accidentally made 1 byte shorter than expected.
    auto delta = (fpos2 - fpos1) - ((int) ((ph_.dataLength + 7) / 8));
    if (delta > 0) {
      ifs->seekg(delta, ifs->cur);
      ASSERT(*ifs);
    }
  }

  // Current position is the start of the data section,
  // and the 0-offset for other code that uses it.
  ifs->mark();

  return std::unique_ptr<std::istream>(ifs.release());
}